

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O2

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::
set(boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *this,base_iterator p)

{
  element_type *peVar1;
  bool bVar2;
  difference_type __d;
  ptrdiff_t pVar3;
  __normal_iterator<const_booster::locale::boundary::break_info_*,_std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
  _Var4;
  size_t sVar5;
  iterator_type local_28;
  ptrdiff_t local_20;
  undefined4 local_18;
  
  local_28._M_node = p._M_node;
  pVar3 = std::__distance<wchar_t>((this->map_->begin_)._M_node);
  peVar1 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_18 = 0;
  local_20 = pVar3;
  _Var4 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<booster::locale::boundary::break_info_const*,std::vector<booster::locale::boundary::break_info,std::allocator<booster::locale::boundary::break_info>>>,booster::locale::boundary::break_info,__gnu_cxx::__ops::_Iter_less_val>
                    ((peVar1->
                     super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (peVar1->
                     super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  peVar1 = (this->map_->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  sVar5 = ((long)_Var4._M_current -
           (long)(peVar1->
                 super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4) -
          (ulong)(_Var4._M_current ==
                 (peVar1->
                 super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
  do {
    this->current_ = sVar5;
    bVar2 = valid_offset(this,sVar5);
    sVar5 = this->current_ + 1;
  } while (!bVar2);
  sVar5 = get_offset(this,this->current_);
  std::__advance<std::_List_iterator<wchar_t>,long>(&local_28,sVar5 - pVar3);
  (this->value_).iterator_._M_node = local_28._M_node;
  update_rule(this);
  return;
}

Assistant:

void set(base_iterator p)
                    {
                        size_t dist =  std::distance(map_->begin(),p);

                        index_type::const_iterator b=index().begin();
                        index_type::const_iterator e=index().end();
                        index_type::const_iterator ptr = std::lower_bound(b,e,break_info(dist));

                        if(ptr==index().end())
                            current_=size()-1;
                        else
                            current_=ptr - index().begin();

                        while(!valid_offset(current_))
                            current_ ++;

                        std::ptrdiff_t diff = get_offset(current_) - dist;
                        std::advance(p,diff);
                        value_.iterator(p);
                        update_rule();
                    }